

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# creadhb.c
# Opt level: O0

int cParseFloatFormat(char *buf,int *num,int *size)

{
  char cVar1;
  int iVar2;
  char *__nptr;
  bool bVar3;
  char *local_30;
  char *period;
  char *tmp;
  int *size_local;
  int *num_local;
  char *buf_local;
  
  period = buf;
  do {
    __nptr = period + 1;
    cVar1 = *period;
    period = __nptr;
  } while (cVar1 != '(');
  iVar2 = atoi(__nptr);
  *num = iVar2;
  while( true ) {
    bVar3 = false;
    if ((((*period != 'E') && (bVar3 = false, *period != 'e')) && (bVar3 = false, *period != 'D'))
       && ((bVar3 = false, *period != 'd' && (bVar3 = false, *period != 'F')))) {
      bVar3 = *period != 'f';
    }
    if (!bVar3) break;
    if ((*period == 'p') || (*period == 'P')) {
      iVar2 = atoi(period + 1);
      *num = iVar2;
    }
    period = period + 1;
  }
  local_30 = period + 1;
  while( true ) {
    bVar3 = false;
    if (*local_30 != '.') {
      bVar3 = *local_30 != ')';
    }
    if (!bVar3) break;
    local_30 = local_30 + 1;
  }
  *local_30 = '\0';
  iVar2 = atoi(period + 1);
  *size = iVar2;
  return 0;
}

Assistant:

int cParseFloatFormat(char *buf, int *num, int *size)
{
    char *tmp, *period;
    
    tmp = buf;
    while (*tmp++ != '(') ;
    *num = atoi(tmp); /*sscanf(tmp, "%d", num);*/
    while (*tmp != 'E' && *tmp != 'e' && *tmp != 'D' && *tmp != 'd'
	   && *tmp != 'F' && *tmp != 'f') {
        /* May find kP before nE/nD/nF, like (1P6F13.6). In this case the
           num picked up refers to P, which should be skipped. */
        if (*tmp=='p' || *tmp=='P') {
           ++tmp;
           *num = atoi(tmp); /*sscanf(tmp, "%d", num);*/
        } else {
           ++tmp;
        }
    }
    ++tmp;
    period = tmp;
    while (*period != '.' && *period != ')') ++period ;
    *period = '\0';
    *size = atoi(tmp); /*sscanf(tmp, "%2d", size);*/

    return 0;
}